

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O2

void __thiscall chrono::ChConveyor::Update(ChConveyor *this,double mytime,bool update_assets)

{
  undefined8 uVar1;
  ChBody *pCVar2;
  bool bVar3;
  undefined7 in_register_00000031;
  ChBody *pCVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChVector<double> v;
  ChVector<double> local_88;
  ChVector<double> local_68;
  undefined1 local_48 [24];
  
  ChPhysicsItem::Update(&this->super_ChPhysicsItem,mytime,update_assets);
  (*(this->conveyor_truss->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])
            (mytime,this->conveyor_truss,CONCAT71(in_register_00000031,update_assets) & 0xffffffff);
  bVar3 = ChBody::GetBodyFixed(this->conveyor_truss);
  if (bVar3) {
    ChVariablesBodyOwnMass::SetBodyMass(&this->conveyor_plate->variables,100000.0);
    local_88.m_data[0] = 100000.0;
    local_88.m_data[1] = 100000.0;
    local_88.m_data[2] = 100000.0;
    ChBody::SetInertiaXX(this->conveyor_plate,&local_88);
    pCVar4 = this->conveyor_plate;
    local_88.m_data[2] = 0.0;
    local_88.m_data[0] = 0.0;
    local_88.m_data[1] = 0.0;
  }
  else {
    ChVariablesBodyOwnMass::SetBodyMass
              (&this->conveyor_plate->variables,(this->conveyor_truss->variables).mass);
    pCVar4 = this->conveyor_plate;
    ChBody::GetInertiaXX(this->conveyor_truss);
    ChBody::SetInertiaXX(pCVar4,&local_88);
    pCVar4 = this->conveyor_plate;
    ChBody::GetInertiaXY(this->conveyor_truss);
  }
  ChBody::SetInertiaXY(pCVar4,&local_88);
  ChFrame<double>::SetCoord
            ((ChFrame<double> *)&this->conveyor_plate->super_ChBodyFrame,
             &(this->conveyor_truss->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord);
  (*(this->conveyor_plate->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
    _vptr_ChFrame[6])(&this->conveyor_plate->super_ChBodyFrame,
                      &(this->conveyor_truss->super_ChBodyFrame).super_ChFrameMoving<double>.
                       coord_dt);
  local_48._0_8_ = this->conveyor_speed;
  pCVar4 = this->conveyor_truss;
  pCVar2 = this->conveyor_plate;
  local_48._8_16_ = ZEXT816(0) << 0x20;
  ChFrame<double>::TransformLocalToParent
            (&local_68,(ChFrame<double> *)&pCVar4->super_ChBodyFrame,(ChVector<double> *)local_48);
  local_88.m_data[0] =
       (pCVar4->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[0] +
       local_68.m_data[0];
  local_88.m_data[1] =
       (pCVar4->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[1] +
       local_68.m_data[1];
  local_88.m_data[2] =
       (pCVar4->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2] +
       local_68.m_data[2];
  (*(pCVar2->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame[7])
            (&pCVar2->super_ChBodyFrame);
  (*(this->conveyor_plate->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])
            (mytime,this->conveyor_plate,update_assets);
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)&local_68,
             &(this->internal_link->motion_X).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
  std::static_pointer_cast<chrono::ChFunction_Ramp,chrono::ChFunction>
            ((shared_ptr<chrono::ChFunction> *)&local_88);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = this->conveyor_speed;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar5 = vxorpd_avx512vl(auVar6,auVar5);
  uVar1 = vmovlpd_avx(auVar5);
  *(undefined8 *)((long)local_88.m_data[0] + 0x10) = uVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88.m_data + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68.m_data + 1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)&local_68,
             &(this->internal_link->motion_X).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
  std::static_pointer_cast<chrono::ChFunction_Ramp,chrono::ChFunction>
            ((shared_ptr<chrono::ChFunction> *)&local_88);
  *(double *)((long)local_88.m_data[0] + 8) =
       this->conveyor_speed * (this->super_ChPhysicsItem).super_ChObj.ChTime;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88.m_data + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68.m_data + 1));
  (**(code **)((long)(this->internal_link->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.
                     super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj + 0x98))
            (mytime,this->internal_link,update_assets);
  return;
}

Assistant:

void ChConveyor::Update(double mytime, bool update_assets) {
    // inherit parent class function
    ChPhysicsItem::Update(mytime, update_assets);

    conveyor_truss->Update(mytime, update_assets);

    if (conveyor_truss->GetBodyFixed()) {
        double largemass = 100000;
        conveyor_plate->SetMass(largemass);
        conveyor_plate->SetInertiaXX(ChVector<>(largemass, largemass, largemass));
        conveyor_plate->SetInertiaXY(ChVector<>(0, 0, 0));
    } else {
        conveyor_plate->SetMass(conveyor_truss->GetMass());
        conveyor_plate->SetInertiaXX(conveyor_truss->GetInertiaXX());
        conveyor_plate->SetInertiaXY(conveyor_truss->GetInertiaXY());
    }

    // keep the plate always at the same position of the main reference
    conveyor_plate->SetCoord(conveyor_truss->GetCoord());
    conveyor_plate->SetCoord_dt(conveyor_truss->GetCoord_dt());
    // keep the plate always at the same speed of the main reference, plus the conveyor speed on X local axis
    conveyor_plate->SetPos_dt(conveyor_truss->GetPos_dt() + (ChVector<>(conveyor_speed, 0, 0) >> (*conveyor_truss)));

    conveyor_plate->Update(mytime, update_assets);

    std::static_pointer_cast<ChFunction_Ramp>(internal_link->GetMotion_X())->Set_ang(-conveyor_speed);
    // always zero pos. offset (trick):
    std::static_pointer_cast<ChFunction_Ramp>(internal_link->GetMotion_X())->Set_y0(+conveyor_speed * GetChTime());

    internal_link->Update(mytime, update_assets);
}